

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_poly(REF_GRID ref_grid,char *filename)

{
  REF_STATUS RVar1;
  uint uVar2;
  double dVar3;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL hole [3];
  double local_148;
  REF_DBL center [3];
  REF_DBL offset;
  REF_DBL normal [3];
  double local_108;
  REF_DBL max_area;
  REF_DBL area;
  uint local_f0;
  REF_INT largest_triangle;
  REF_INT nhole;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_INT faceid;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT mark;
  REF_INT attr;
  REF_INT dim;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT ntri;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x3ef,
           "ref_export_poly","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    mark = 3;
    ref_private_macro_code_rss = 0;
    faceid = 0;
    fprintf((FILE *)ref_node,"%d  %d  %d  %d\n",(ulong)ref_cell->type,3,0,0);
    min_faceid = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)&ntri);
    if (min_faceid == 0) {
      min_faceid = 0;
      for (o2n._4_4_ = 0; (int)o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)ref_node,"%d  %.16e  %.16e  %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf + 2) * 2),
                (ulong)o2n._4_4_);
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      dim = pRStack_38->node_per;
      nodes[0x1a] = pRStack_38->n;
      faceid = 1;
      fprintf((FILE *)ref_node,"%d  %d\n",(ulong)(uint)nodes[0x1a],1);
      for (attr = 0; attr < pRStack_38->max; attr = attr + 1) {
        RVar1 = ref_cell_nodes(pRStack_38,attr,&cell);
        if (RVar1 == 0) {
          fprintf((FILE *)ref_node,"1 0 1\n%d  %d %d %d  %d\n",(ulong)(uint)dim,
                  (ulong)(uint)n2o[cell],(ulong)(uint)n2o[node_per],(ulong)(uint)n2o[nodes[0]],
                  nodes[1]);
        }
      }
      uVar2 = ref_export_faceid_range((REF_GRID)filename_local,&nhole,&largest_triangle);
      if (uVar2 == 0) {
        local_f0 = 0;
        for (max_faceid = nhole; max_faceid <= largest_triangle; max_faceid = max_faceid + 1) {
          local_108 = -1.0;
          area._4_4_ = -1;
          for (attr = 0; attr < pRStack_38->max; attr = attr + 1) {
            RVar1 = ref_cell_nodes(pRStack_38,attr,&cell);
            if ((RVar1 == 0) && ((&cell)[dim] == max_faceid)) {
              uVar2 = ref_node_tri_area((REF_NODE)ref_cell,&cell,&max_area);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x41a,"ref_export_poly",(ulong)uVar2,"area");
                return uVar2;
              }
              if (local_108 < max_area) {
                local_108 = max_area;
                area._4_4_ = attr;
              }
            }
          }
          if (area._4_4_ != -1) {
            uVar2 = ref_cell_nodes(pRStack_38,area._4_4_,&cell);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x422,"ref_export_poly",(ulong)uVar2,"tri nodes");
              return uVar2;
            }
            uVar2 = ref_node_tri_normal((REF_NODE)ref_cell,&cell,&offset);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x423,"ref_export_poly",(ulong)uVar2,"normal");
              return uVar2;
            }
            uVar2 = ref_math_normalize(&offset);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x424,"ref_export_poly",(ulong)uVar2,"norm");
              return uVar2;
            }
            dVar3 = sqrt(local_108);
            center[2] = dVar3 * 0.0001;
            if (1e-12 < center[2]) {
              local_f0 = local_f0 + 1;
            }
          }
        }
        fprintf((FILE *)ref_node,"%d\n",(ulong)local_f0);
        local_f0 = 0;
        for (max_faceid = nhole; max_faceid <= largest_triangle; max_faceid = max_faceid + 1) {
          local_108 = -1.0;
          area._4_4_ = -1;
          for (attr = 0; attr < pRStack_38->max; attr = attr + 1) {
            RVar1 = ref_cell_nodes(pRStack_38,attr,&cell);
            if ((RVar1 == 0) && ((&cell)[dim] == max_faceid)) {
              uVar2 = ref_node_tri_area((REF_NODE)ref_cell,&cell,&max_area);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x432,"ref_export_poly",(ulong)uVar2,"area");
                return uVar2;
              }
              if (local_108 < max_area) {
                local_108 = max_area;
                area._4_4_ = attr;
              }
            }
          }
          if (area._4_4_ != -1) {
            uVar2 = ref_cell_nodes(pRStack_38,area._4_4_,&cell);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x43a,"ref_export_poly",(ulong)uVar2,"tri nodes");
              return uVar2;
            }
            uVar2 = ref_node_tri_normal((REF_NODE)ref_cell,&cell,&offset);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x43b,"ref_export_poly",(ulong)uVar2,"normal");
              return uVar2;
            }
            uVar2 = ref_math_normalize(&offset);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                     ,0x43c,"ref_export_poly",(ulong)uVar2,"norm");
              return uVar2;
            }
            dVar3 = sqrt(local_108);
            center[2] = dVar3 * 0.0001;
            if (1e-12 < center[2]) {
              uVar2 = ref_node_tri_centroid((REF_NODE)ref_cell,&cell,&local_148);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                       ,0x43f,"ref_export_poly",(ulong)uVar2,"center");
                return uVar2;
              }
              fprintf((FILE *)ref_node,"%d  %.16e  %.16e  %.16e\n",-center[2] * offset + local_148,
                      -center[2] * normal[0] + center[0],-center[2] * normal[1] + center[1],
                      (ulong)local_f0);
              local_f0 = local_f0 + 1;
            }
          }
        }
        fprintf((FILE *)ref_node,"0\n");
        if (_ntri != (REF_INT *)0x0) {
          free(_ntri);
        }
        if (n2o != (REF_INT *)0x0) {
          free(n2o);
        }
        fclose((FILE *)ref_node);
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x413,"ref_export_poly",(ulong)uVar2,"range");
        ref_grid_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x3f8,"ref_export_poly",(ulong)(uint)min_faceid,"compact");
      ref_grid_local._4_4_ = min_faceid;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_poly(REF_GRID ref_grid,
                                          const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT dim, attr, mark;
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  /* Part 1 - node list */
  nnode = ref_node_n(ref_node);
  dim = 3;
  attr = 0;
  mark = 0;
  fprintf(file, "%d  %d  %d  %d\n", nnode, dim, attr, mark);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, "%d  %.16e  %.16e  %.16e\n", node,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  /* Part 2 - facet list */
  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  ntri = ref_cell_n(ref_cell);
  mark = 1;
  fprintf(file, "%d  %d\n", ntri, mark);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, "1 0 1\n%d  %d %d %d  %d\n", node_per, o2n[nodes[0]],
            o2n[nodes[1]], o2n[nodes[2]], nodes[3]);
  }

  /* Part 3 hole - list */
  /* create one hole point for each convex edge,
     expect right hand triangle to point into domain */
  {
    REF_INT faceid, min_faceid, max_faceid;
    REF_INT nhole, largest_triangle;
    REF_DBL area, max_area, normal[3], offset, center[3], hole[3];
    RSS(ref_export_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");
    nhole = 0;
    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      max_area = -1.0;
      largest_triangle = REF_EMPTY;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
          if (area > max_area) {
            max_area = area;
            largest_triangle = cell;
          }
        }
      }
      if (REF_EMPTY != largest_triangle) {
        RSS(ref_cell_nodes(ref_cell, largest_triangle, nodes), "tri nodes");
        RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal");
        RSS(ref_math_normalize(normal), "norm");
        offset = 1.0e-4 * sqrt(max_area);
        if (offset > 1.0e-12) {
          nhole += 1;
        }
      }
    }
    fprintf(file, "%d\n", nhole);
    nhole = 0;
    for (faceid = min_faceid; faceid <= max_faceid; faceid++) {
      max_area = -1.0;
      largest_triangle = REF_EMPTY;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (nodes[node_per] == faceid) {
          RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
          if (area > max_area) {
            max_area = area;
            largest_triangle = cell;
          }
        }
      }
      if (REF_EMPTY != largest_triangle) {
        RSS(ref_cell_nodes(ref_cell, largest_triangle, nodes), "tri nodes");
        RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal");
        RSS(ref_math_normalize(normal), "norm");
        offset = 1.0e-4 * sqrt(max_area);
        if (offset > 1.0e-12) {
          RSS(ref_node_tri_centroid(ref_node, nodes, center), "center");
          hole[0] = center[0] - offset * normal[0];
          hole[1] = center[1] - offset * normal[1];
          hole[2] = center[2] - offset * normal[2];
          fprintf(file, "%d  %.16e  %.16e  %.16e\n", nhole, hole[0], hole[1],
                  hole[2]);
          nhole += 1;
        }
      }
    }
  }

  /* Part 4 - region attributes list */
  fprintf(file, "0\n"); /* no regions */

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}